

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall testing::internal::UnitTestImpl::ConfigureStreamingOutput(UnitTestImpl *this)

{
  long lVar1;
  StreamingListener *this_00;
  ostream *poVar2;
  string local_60;
  string local_40;
  
  if (DAT_00156618 != 0) {
    lVar1 = std::__cxx11::string::find('\x10',0x3a);
    if (lVar1 == -1) {
      GTestLog::GTestLog((GTestLog *)&local_60,GTEST_WARNING,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/coignetp[P]template-project-cpp/third_party/googletest/googletest/src/gtest.cc"
                         ,0x1398);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"unrecognized streaming target \"",0x1f);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,FLAGS_gtest_stream_result_to_abi_cxx11_,DAT_00156618
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\" ignored.",10);
      GTestLog::~GTestLog((GTestLog *)&local_60);
    }
    else {
      this_00 = (StreamingListener *)operator_new(0x10);
      std::__cxx11::string::substr((ulong)&local_60,0x156610);
      std::__cxx11::string::substr((ulong)&local_40,0x156610);
      StreamingListener::StreamingListener(this_00,&local_60,&local_40);
      TestEventRepeater::Append((this->listeners_).repeater_,(TestEventListener *)this_00);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p);
      }
    }
  }
  return;
}

Assistant:

AssertionResult AssertionResult::operator!() const {
  AssertionResult negation(!success_);
  if (message_.get() != nullptr) negation << *message_;
  return negation;
}